

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O0

char * absl::lts_20250127::str_format_internal::anon_unknown_0::PrintIntegralDigitsFromRightFast
                 (uint128 v,char *p)

{
  char cVar1;
  char *pcVar2;
  int in_ECX;
  uint128 lhs;
  unsigned_long uStack_50;
  char carry;
  uint64_t low;
  uint64_t local_40;
  uint128 local_38;
  unsigned_long local_28;
  uint64_t high;
  char *p_local;
  uint128 v_local;
  
  lhs.lo_ = v.hi_;
  low = v.lo_;
  lhs.hi_ = 0x40;
  local_40 = lhs.lo_;
  high = (uint64_t)p;
  p_local = (char *)low;
  v_local.lo_ = lhs.lo_;
  local_38 = operator>>((lts_20250127 *)low,lhs,in_ECX);
  local_28 = uint128::operator_cast_to_unsigned_long(&local_38);
  uStack_50 = uint128::operator_cast_to_unsigned_long((uint128 *)&p_local);
  while (local_28 != 0) {
    cVar1 = DivideBy10WithCarry(&local_28,'\0');
    cVar1 = DivideBy10WithCarry(&stack0xffffffffffffffb0,cVar1);
    *(char *)(high - 1) = cVar1 + '0';
    high = high - 1;
  }
  pcVar2 = PrintIntegralDigitsFromRightFast(uStack_50,(char *)high);
  return pcVar2;
}

Assistant:

char *PrintIntegralDigitsFromRightFast(uint128 v, char *p) {
  auto high = static_cast<uint64_t>(v >> 64);
  auto low = static_cast<uint64_t>(v);

  while (high != 0) {
    char carry = DivideBy10WithCarry(&high, 0);
    carry = DivideBy10WithCarry(&low, carry);
    *--p = carry + '0';
  }
  return PrintIntegralDigitsFromRightFast(low, p);
}